

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_tree.hpp
# Opt level: O2

RowGroup * __thiscall
duckdb::SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
          (SegmentTree<duckdb::RowGroup,_true> *this,RowGroup *segment)

{
  RowGroup *pRVar1;
  SegmentLock l;
  unique_lock<std::mutex> uStack_28;
  
  if (((this->finished_loading)._M_base._M_i & 1U) == 0) {
    ::std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->node_lock);
    pRVar1 = GetNextSegment(this,(SegmentLock *)&uStack_28,segment);
    ::std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  }
  else {
    pRVar1 = (segment->super_SegmentBase<duckdb::RowGroup>).next._M_b._M_p;
  }
  return pRVar1;
}

Assistant:

T *GetNextSegment(T *segment) {
		if (!SUPPORTS_LAZY_LOADING) {
			return segment->Next();
		}
		if (finished_loading) {
			return segment->Next();
		}
		auto l = Lock();
		return GetNextSegment(l, segment);
	}